

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::DG2Dot
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *dg,uint32_t opts,char *file)

{
  _Rb_tree_header *p_Var1;
  map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *local_20;
  
  this->_vptr_DG2Dot = (_func_int **)&PTR_printKey_00140b98;
  p_Var1 = &(this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header;
  (this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dumpedGlobals)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->criteria)._M_t._M_impl.super__Rb_tree_header;
  (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->criteria)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->options = opts;
  this->dd_color = "cyan4";
  this->use_color = "black";
  this->cd_color = "blue";
  this->cfg_color = "gray";
  this->dg = dg;
  this->file = file;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->subgraphs)._M_t._M_impl.super__Rb_tree_header;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subgraphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ofstream::ofstream(&this->out);
  local_20 = (map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
              *)0x0;
  std::
  _Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
  ::
  _M_insert_unique<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>
            ((_Rb_tree<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*,std::_Identity<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::less<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>,std::allocator<std::map<llvm::Value*,dg::LLVMNode*,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::LLVMNode*>>>const*>>
              *)&this->dumpedGlobals,&local_20);
  reopen(this,file);
  return;
}

Assistant:

DG2Dot<NodeT>(DependenceGraph<NodeT> *dg,
                  uint32_t opts = PRINT_CFG | PRINT_DD | PRINT_CD | PRINT_USE,
                  const char *file = nullptr)
            : options(opts), dg(dg), file(file) {
        // if a graph has no global nodes, this will forbid trying to print them
        dumpedGlobals.insert(nullptr);
        reopen(file);
    }